

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Own<kj::Directory::Replacer<kj::File>,_std::nullptr_t> __thiscall
kj::anon_unknown_9::DiskHandle::replaceFile(DiskHandle *this,PathPtr path,WriteMode mode)

{
  PathPtr finalName;
  bool bVar1;
  OwnFd *other;
  String *params_2;
  undefined4 in_register_0000000c;
  Replacer<kj::File> *extraout_RDX;
  String *this_00;
  WriteMode in_R8D;
  Own<kj::Directory::Replacer<kj::File>,_std::nullptr_t> OVar2;
  String local_e0;
  OwnFd local_c4;
  undefined1 local_c0 [32];
  OwnFd local_a0 [2];
  OwnFd newFd;
  Type local_90;
  Function<int_(kj::StringPtr)> local_78;
  String *local_68;
  coroutine_handle<void> cStack_60;
  undefined1 local_50 [8];
  String temp;
  uint local_30;
  int newFd_;
  mode_t acl;
  WriteMode mode_local;
  DiskHandle *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)CONCAT44(in_register_0000000c,mode);
  this_local = (DiskHandle *)path.parts.size_;
  this_00 = path.parts.ptr;
  local_30 = 0x1b6;
  newFd_ = in_R8D;
  _acl = this_00;
  path_local.parts.size_ = (size_t)this;
  bVar1 = has<kj::WriteMode,void>(in_R8D,EXECUTABLE);
  if (bVar1) {
    local_30 = 0x1ff;
  }
  bVar1 = has<kj::WriteMode,void>(newFd_,PRIVATE);
  if (bVar1) {
    local_30 = local_30 & 0x1c0;
  }
  local_68 = (String *)this_local;
  cStack_60._M_fr_ptr = path_local.parts.ptr;
  local_90.newFd_ = (int *)((long)&temp.content.disposer + 4);
  local_90.acl = &stack0xffffffffffffffd0;
  local_90.this = (DiskHandle *)this_00;
  Function<int(kj::StringPtr)>::
  Function<kj::(anonymous_namespace)::DiskHandle::replaceFile(kj::PathPtr,kj::WriteMode)const::_lambda(kj::StringPtr)_1_>
            ((Function<int(kj::StringPtr)> *)&local_78,&local_90);
  finalName.parts.size_ = (size_t)cStack_60._M_fr_ptr;
  finalName.parts.ptr = local_68;
  createNamedTemporary((String *)local_50,(DiskHandle *)this_00,finalName,newFd_,&local_78);
  Function<int_(kj::StringPtr)>::~Function(&local_78);
  OwnFd::OwnFd(local_a0,temp.content.disposer._4_4_);
  other = mv<kj::OwnFd>(local_a0);
  OwnFd::OwnFd(&local_c4,other);
  newDiskFile((kj *)local_c0,&local_c4);
  params_2 = mv<kj::String>((String *)local_50);
  PathPtr::toString(&local_e0,(PathPtr *)&this_local,false);
  heap<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::File>,kj::Own<kj::File,decltype(nullptr)>,kj::(anonymous_namespace)::DiskHandle_const&,kj::String,kj::String,kj::WriteMode&>
            ((kj *)(local_c0 + 0x10),(Own<kj::File,_std::nullptr_t> *)local_c0,(DiskHandle *)this_00
             ,params_2,&local_e0,(WriteMode *)&newFd_);
  Own<kj::Directory::Replacer<kj::File>,decltype(nullptr)>::
  Own<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::File>,void>
            ((Own<kj::Directory::Replacer<kj::File>,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::File>,_std::nullptr_t> *)
             (local_c0 + 0x10));
  Own<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::File>,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::File>,_std::nullptr_t> *)
             (local_c0 + 0x10));
  String::~String(&local_e0);
  Own<kj::File,_std::nullptr_t>::~Own((Own<kj::File,_std::nullptr_t> *)local_c0);
  OwnFd::~OwnFd(&local_c4);
  OwnFd::~OwnFd(local_a0);
  String::~String((String *)local_50);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<Directory::Replacer<File>> replaceFile(PathPtr path, WriteMode mode) const {
    mode_t acl = 0666;
    if (has(mode, WriteMode::EXECUTABLE)) {
      acl = 0777;
    }
    if (has(mode, WriteMode::PRIVATE)) {
      acl &= 0700;
    }

    int newFd_;
    auto temp = createNamedTemporary(path, mode,
        [&](StringPtr candidatePath) {
      return newFd_ = openat(fd, candidatePath.cStr(),
                             O_RDWR | O_CREAT | O_EXCL | MAYBE_O_CLOEXEC, acl);
    });
    OwnFd newFd(newFd_);
#ifndef O_CLOEXEC
    setCloexec(newFd);
#endif
    return heap<ReplacerImpl<File>>(newDiskFile(kj::mv(newFd)), *this, kj::mv(temp),
                                    path.toString(), mode);
  }